

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

int __thiscall Catch::TablePrinter::open(TablePrinter *this,char *__file,int __oflag,...)

{
  pointer pCVar1;
  ostream *poVar2;
  int in_EAX;
  int extraout_EAX;
  pointer text;
  Columns headerCols;
  Column local_70;
  
  if (this->m_isOpen == false) {
    this->m_isOpen = true;
    Catch::operator<<();
    headerCols.m_columns.
    super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    headerCols.m_columns.
    super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    headerCols.m_columns.
    super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pCVar1 = (this->m_columnInfos).
             super__Vector_base<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (text = (this->m_columnInfos).
                super__Vector_base<Catch::ColumnInfo,_std::allocator<Catch::ColumnInfo>_>._M_impl.
                super__Vector_impl_data._M_start; text != pCVar1; text = text + 1) {
      TextFlow::Column::Column(&local_70,&text->name);
      local_70.m_width = text->width - 2;
      std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::
      emplace_back<Catch::TextFlow::Column>(&headerCols.m_columns,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      TextFlow::Spacer(&local_70,2);
      std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::
      emplace_back<Catch::TextFlow::Column>(&headerCols.m_columns,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    poVar2 = this->m_os;
    TextFlow::operator<<(poVar2,&headerCols);
    std::operator<<(poVar2,'\n');
    poVar2 = this->m_os;
    Catch::operator<<(poVar2,(lineOfChars)0x2d);
    std::operator<<(poVar2,'\n');
    std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
              (&headerCols.m_columns);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void open() {
        if (!m_isOpen) {
            m_isOpen = true;
            *this << RowBreak();

			TextFlow::Columns headerCols;
			for (auto const& info : m_columnInfos) {
                assert(info.width > 2);
				headerCols += TextFlow::Column(info.name).width(info.width - 2);
                headerCols += TextFlow::Spacer( 2 );
			}
			m_os << headerCols << '\n';

            m_os << lineOfChars('-') << '\n';
        }
    }